

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.cpp
# Opt level: O2

SchemaAttDef * __thiscall
xercesc_4_0::XercesAttGroupInfo::getAttDef(XercesAttGroupInfo *this,XMLCh *baseName,int uriId)

{
  XMLSize_t XVar1;
  bool bVar2;
  SchemaAttDef *pSVar3;
  XMLSize_t i;
  XMLSize_t getAt;
  
  if (this->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    return (SchemaAttDef *)0x0;
  }
  XVar1 = (this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fCurCount;
  getAt = 0;
  while( true ) {
    if (XVar1 == getAt) {
      return (SchemaAttDef *)0x0;
    }
    pSVar3 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                       (&this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,getAt);
    if ((pSVar3->fAttName->fURIId == uriId) &&
       (bVar2 = XMLString::equals(baseName,pSVar3->fAttName->fLocalPart), bVar2)) break;
    getAt = getAt + 1;
  }
  return pSVar3;
}

Assistant:

const SchemaAttDef* XercesAttGroupInfo::getAttDef(const XMLCh* const baseName,
                                                  const int uriId) const {

    // If no list, then return a null
    if (!fAttributes)
        return 0;

    XMLSize_t attSize = fAttributes->size();

    for (XMLSize_t i=0; i<attSize; i++) {

        const SchemaAttDef* attDef = fAttributes->elementAt(i);
        QName* attName = attDef->getAttName();

        if (uriId == (int) attName->getURI() &&
			XMLString::equals(baseName, attName->getLocalPart())) {

            return attDef;
        }
    }

    return 0;
}